

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_dec
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  unsigned_type *puVar1;
  dec_writer f;
  undefined1 auVar2 [16];
  int iVar3;
  int num_digits;
  ulong uVar4;
  ulong uVar5;
  string_view prefix;
  undefined1 auVar6 [16];
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  puVar1 = &this->abs_value;
  auVar6 = (undefined1  [16])*puVar1;
  auVar2 = (undefined1  [16])*puVar1;
  num_digits = 1;
  if ((ulong)((ulong)*puVar1 < 10) <= *(ulong *)((long)&this->abs_value + 8)) {
    iVar3 = 4;
    do {
      num_digits = iVar3;
      uVar4 = auVar6._8_8_;
      uVar5 = auVar6._0_8_;
      if (uVar4 == 0 && (ulong)(99 < uVar5) <= -uVar4) {
        num_digits = num_digits + -2;
        goto LAB_0013ec3f;
      }
      if (uVar4 == 0 && (ulong)(999 < uVar5) <= -uVar4) {
        num_digits = num_digits + -1;
        goto LAB_0013ec3f;
      }
      if (uVar4 < (uVar5 < 10000)) goto LAB_0013ec3f;
      auVar6 = __udivti3(uVar5,uVar4,10000,0);
      iVar3 = num_digits + 4;
    } while (uVar4 != 0 || -uVar4 < (ulong)(99999 < uVar5));
    num_digits = num_digits + 1;
  }
LAB_0013ec3f:
  f._20_4_ = uStack_44;
  f.num_digits = num_digits;
  f.abs_value = (unsigned_type)auVar2;
  f._24_8_ = uStack_40;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
             *this->specs,f);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }